

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_handler.hpp
# Opt level: O2

void get_files(string *source_dir,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *image_path)

{
  string *psVar1;
  long lVar2;
  ostream *poVar3;
  directory_iterator __end1;
  string img_p;
  directory_iterator local_c8;
  undefined8 local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_b0;
  __shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
  local_a8;
  __shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
  local_98;
  __shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
  local_80;
  path local_70;
  
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_70,source_dir);
  CLI::std::experimental::filesystem::v1::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&local_a8,&local_70);
  CLI::std::experimental::filesystem::v1::__cxx11::path::~path(&local_70);
  CLI::std::
  __shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_98,&local_a8);
  local_c8._M_dir.
  super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = local_98._M_ptr;
  local_c8._M_dir.
  super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_98._M_refcount._M_pi;
  local_98._M_ptr = (element_type *)0x0;
  local_98._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
  CLI::std::
  __shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_80,&local_a8);
  local_b8 = 0;
  _Stack_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  do {
    if (local_c8._M_dir.
        super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi == _Stack_b0._M_pi) {
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_b0);
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_c8._M_dir.
                  super___shared_ptr<std::experimental::filesystem::v1::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
      std::
      __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::__cxx11::string,std::__cxx11::string)>>
                ((image_path->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
                 (image_path->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish,
                 (_Iter_comp_iter<bool_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                  )0x10bb5c);
      poVar3 = std::operator<<((ostream *)&std::cout,"done");
      std::endl<char,std::char_traits<char>>(poVar3);
      return;
    }
    psVar1 = (string *)
             std::experimental::filesystem::v1::__cxx11::directory_iterator::operator*(&local_c8);
    std::__cxx11::string::string((string *)&local_70,psVar1);
    lVar2 = std::__cxx11::string::find((char *)&local_70,0x1380fb);
    if (lVar2 == -1) {
      lVar2 = std::__cxx11::string::find((char *)&local_70,0x138100);
      if (lVar2 != -1) goto LAB_0010bc6f;
      lVar2 = std::__cxx11::string::find((char *)&local_70,0x138106);
      if (lVar2 != -1) goto LAB_0010bc6f;
    }
    else {
LAB_0010bc6f:
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(image_path,&local_70._M_pathname);
    }
    std::__cxx11::string::~string((string *)&local_70);
    std::experimental::filesystem::v1::__cxx11::directory_iterator::operator++(&local_c8);
  } while( true );
}

Assistant:

void get_files(string source_dir, vector<string> &image_path)
{

    
    for (const auto &entry : experimental::filesystem::directory_iterator(source_dir))
    {
        string img_p = entry.path();
        if ((img_p.find(".jpg") != std::string::npos) or (img_p.find(".jpeg") != std::string::npos) or (img_p.find(".png") != std::string::npos))
        {
            image_path.push_back(img_p);
        }
    }
    sort(image_path.begin(), image_path.end(), comp);
    cout << "done"<<endl;
}